

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblp_std.cpp
# Opt level: O3

void __thiscall XMLElement::XMLElement(XMLElement *this,SymbolContext<char> *ctx)

{
  _Rb_tree_header *p_Var1;
  string *psVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__args;
  pointer pcVar3;
  XMLElementBody *old;
  long lVar4;
  long lVar5;
  
  p_Var1 = &(this->m_attributes)._M_t._M_impl.super__Rb_tree_header;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  (this->m_name)._M_string_length = 0;
  (this->m_name).field_2._M_local_buf[0] = '\0';
  (this->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_body).m_content._M_dataplus._M_p = (pointer)&(this->m_body).m_content.field_2;
  (this->m_body).m_content._M_string_length = 0;
  (this->m_body).m_content.field_2._M_local_buf[0] = '\0';
  (this->m_body).m_elements.
  super__Vector_base<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_body).m_elements.
  super__Vector_base<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_body).m_elements.
  super__Vector_base<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar2 = (string *)*ctx->values;
  std::__cxx11::string::operator=((string *)this,psVar2);
  if (*(string **)psVar2 != psVar2 + 0x10) {
    operator_delete(*(string **)psVar2);
  }
  operator_delete(psVar2);
  lVar4 = (long)ctx->num_values;
  if (2 < lVar4) {
    lVar5 = 2;
    do {
      __args = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)ctx->values[lVar5 + -1];
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&this->m_attributes,__args);
      pcVar3 = (__args->second)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != &(__args->second).field_2) {
        operator_delete(pcVar3);
      }
      pcVar3 = (__args->first)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != &(__args->first).field_2) {
        operator_delete(pcVar3);
      }
      operator_delete(__args);
      lVar4 = (long)ctx->num_values;
      lVar5 = lVar5 + 1;
    } while (lVar5 < lVar4);
  }
  old = (XMLElementBody *)ctx->values[lVar4 + -1];
  XMLElementBody::operator=(&this->m_body,old);
  std::
  vector<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&old->m_elements);
  pcVar3 = (old->m_content)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(old->m_content).field_2) {
    operator_delete(pcVar3);
  }
  operator_delete(old);
  return;
}

Assistant:

XMLElement(const SymbolContext<char>& ctx)
    {
        std::string *name_str = ctx.value<std::string>(1);
        m_name = std::move(*name_str);
        delete name_str;
        for (int i = 2; i <= ctx.count() - 1; i++)
        {
            XMLAttribute *attr = ctx.value<XMLAttribute>(i);
            m_attributes.insert(*attr);
            delete attr;
        }
        XMLElementBody *body_ptr = ctx.value<XMLElementBody>(ctx.count());
        m_body = std::move(*body_ptr);
        delete body_ptr;
    }